

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O2

void __thiscall
slang::syntax::UnarySelectPropertyExprSyntax::setChild
          (UnarySelectPropertyExprSyntax *this,size_t index,TokenOrSyntax child)

{
  SyntaxNode *pSVar1;
  SelectorSyntax *pSVar2;
  logic_error *this_00;
  Token TVar3;
  allocator<char> local_d9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  string local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  if (index < 5) {
    switch(index) {
    case 0:
      TVar3 = ConstTokenOrSyntax::token(&child.super_ConstTokenOrSyntax);
      (this->op).kind = TVar3.kind;
      (this->op).field_0x2 = TVar3._2_1_;
      (this->op).numFlags = (NumericTokenFlags)TVar3.numFlags.raw;
      (this->op).rawLen = TVar3.rawLen;
      (this->op).info = TVar3.info;
      break;
    case 1:
      TVar3 = ConstTokenOrSyntax::token(&child.super_ConstTokenOrSyntax);
      (this->openBracket).kind = TVar3.kind;
      (this->openBracket).field_0x2 = TVar3._2_1_;
      (this->openBracket).numFlags = (NumericTokenFlags)TVar3.numFlags.raw;
      (this->openBracket).rawLen = TVar3.rawLen;
      (this->openBracket).info = TVar3.info;
      break;
    case 2:
      pSVar1 = TokenOrSyntax::node(&child);
      if (pSVar1 == (SyntaxNode *)0x0) {
        pSVar2 = (SelectorSyntax *)0x0;
      }
      else {
        pSVar1 = TokenOrSyntax::node(&child);
        pSVar2 = SyntaxNode::as<slang::syntax::SelectorSyntax>(pSVar1);
      }
      this->selector = pSVar2;
      break;
    case 3:
      TVar3 = ConstTokenOrSyntax::token(&child.super_ConstTokenOrSyntax);
      (this->closeBracket).kind = TVar3.kind;
      (this->closeBracket).field_0x2 = TVar3._2_1_;
      (this->closeBracket).numFlags = (NumericTokenFlags)TVar3.numFlags.raw;
      (this->closeBracket).rawLen = TVar3.rawLen;
      (this->closeBracket).info = TVar3.info;
      break;
    case 4:
      pSVar1 = TokenOrSyntax::node(&child);
      if (pSVar1 == (SyntaxNode *)0x0) {
        local_d8._M_dataplus._M_p = (pointer)0x0;
      }
      else {
        pSVar1 = TokenOrSyntax::node(&child);
        local_d8._M_dataplus._M_p =
             (pointer)SyntaxNode::as<slang::syntax::PropertyExprSyntax>(pSVar1);
      }
      not_null<slang::syntax::PropertyExprSyntax*>::
      not_null<slang::syntax::PropertyExprSyntax*,void>
                ((not_null<slang::syntax::PropertyExprSyntax*> *)&local_b8,
                 (PropertyExprSyntax **)&local_d8);
      (this->expr).ptr = (PropertyExprSyntax *)local_b8._M_dataplus._M_p;
    }
    return;
  }
  this_00 = (logic_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_78,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/build_O2/extern/slang/source/AllSyntax.cpp"
             ,&local_d9);
  std::operator+(&local_58,&local_78,":");
  std::__cxx11::to_string(&local_98,0x34c3);
  std::operator+(&local_38,&local_58,&local_98);
  std::operator+(&local_d8,&local_38,": ");
  std::operator+(&local_b8,&local_d8,"Default case should be unreachable!");
  std::logic_error::logic_error(this_00,(string *)&local_b8);
  __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
}

Assistant:

void UnarySelectPropertyExprSyntax::setChild(size_t index, TokenOrSyntax child) {
    switch (index) {
        case 0: op = child.token(); return;
        case 1: openBracket = child.token(); return;
        case 2: selector = child.node() ? &child.node()->as<SelectorSyntax>() : nullptr; return;
        case 3: closeBracket = child.token(); return;
        case 4: expr = child.node() ? &child.node()->as<PropertyExprSyntax>() : nullptr; return;
        default: ASSUME_UNREACHABLE;
    }
}